

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

PgHdr * sqlite3PcacheFetchFinish(PCache *pCache,Pgno pgno,sqlite3_pcache_page *pPage)

{
  undefined8 *puVar1;
  PgHdr *pPVar2;
  
  pPVar2 = (PgHdr *)pPage->pExtra;
  if (pPVar2->pPage != (sqlite3_pcache_page *)0x0) {
    pCache->nRefSum = pCache->nRefSum + 1;
    pPVar2->nRef = pPVar2->nRef + 1;
    return pPVar2;
  }
  puVar1 = (undefined8 *)pPage->pExtra;
  puVar1[8] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  *puVar1 = pPage;
  puVar1[1] = pPage->pBuf;
  puVar1[2] = puVar1 + 9;
  puVar1[9] = 0;
  puVar1[3] = pCache;
  *(Pgno *)(puVar1 + 6) = pgno;
  *(undefined2 *)((long)puVar1 + 0x34) = 1;
  pPVar2 = sqlite3PcacheFetchFinish(pCache,pgno,pPage);
  return pPVar2;
}

Assistant:

SQLITE_PRIVATE PgHdr *sqlite3PcacheFetchFinish(
  PCache *pCache,             /* Obtain the page from this cache */
  Pgno pgno,                  /* Page number obtained */
  sqlite3_pcache_page *pPage  /* Page obtained by prior PcacheFetch() call */
){
  PgHdr *pPgHdr;

  assert( pPage!=0 );
  pPgHdr = (PgHdr *)pPage->pExtra;

  if( !pPgHdr->pPage ){
    return pcacheFetchFinishWithInit(pCache, pgno, pPage);
  }
  pCache->nRefSum++;
  pPgHdr->nRef++;
  assert( sqlite3PcachePageSanity(pPgHdr) );
  return pPgHdr;
}